

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  Bool BVar2;
  int iVar3;
  Node *node_00;
  Node *element;
  uint uVar4;
  code *pcStack_a0;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  int HasBase;
  int HasTitle;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *head_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  memory._44_4_ = 0;
  memory.register_2 = 0;
  pNStack_20 = head;
  if (head == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_state;
    memory.register_2 = memory.mode;
  }
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          while( true ) {
            while( true ) {
              node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
              if (node_00 == (Node *)0x0) {
                return (Node *)0x0;
              }
              if ((node_00->tag == pNStack_20->tag) && (node_00->type == EndTag)) {
                prvTidyFreeNode(doc,node_00);
                pNStack_20->closed = yes;
                return (Node *)0x0;
              }
              if (((node_00->tag != pNStack_20->tag) &&
                  (((node_00 == (Node *)0x0 || (node_00->tag == (Dict *)0x0)) ||
                   (node_00->tag->id != TidyTag_HTML)))) || (node_00->type != StartTag)) break;
              prvTidyReport(doc,pNStack_20,node_00,0x235);
              prvTidyFreeNode(doc,node_00);
            }
            BVar2 = prvTidynodeIsText(node_00);
            if (BVar2 != no) {
              if (((int)(doc->config).value[0x3b].v == 0) && ((int)(doc->config).value[6].v != 1)) {
                prvTidyReport(doc,pNStack_20,node_00,0x27e);
              }
              prvTidyUngetToken(doc);
              return (Node *)0x0;
            }
            if (((node_00->type != ProcInsTag) || (node_00->element == (tmbstr)0x0)) ||
               (iVar3 = prvTidytmbstrcmp(node_00->element,"xml-stylesheet"), iVar3 != 0)) break;
            prvTidyReport(doc,pNStack_20,node_00,0x27e);
            element = prvTidyFindHTML(doc);
            prvTidyInsertNodeBeforeElement(element,node_00);
          }
          BVar2 = InsertMisc(pNStack_20,node_00);
        } while (BVar2 != no);
        if (node_00->type != DocTypeTag) break;
        InsertDocType(doc,pNStack_20,node_00);
      }
      if (node_00->tag != (Dict *)0x0) break;
      prvTidyReport(doc,pNStack_20,node_00,0x235);
      prvTidyFreeNode(doc,node_00);
    }
    if ((node_00->tag->model & 4) == 0) {
      if (pLVar1->isvoyager != no) {
        prvTidyReport(doc,pNStack_20,node_00,0x27e);
      }
      prvTidyUngetToken(doc);
      return (Node *)0x0;
    }
    BVar2 = prvTidynodeIsElement(node_00);
    if (BVar2 != no) break;
    prvTidyReport(doc,pNStack_20,node_00,0x235);
    prvTidyFreeNode(doc,node_00);
  }
  if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
     (node_00->tag->id != TidyTag_TITLE)) {
    if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
       ((node_00->tag->id == TidyTag_BASE &&
        (memory.register_2 = memory.register_2 + 1, 1 < memory.register_2)))) {
      uVar4 = 0x280;
      if (pNStack_20 != (Node *)0x0) {
        uVar4 = 0x27f;
      }
      prvTidyReport(doc,pNStack_20,node_00,uVar4);
    }
  }
  else {
    memory._44_4_ = memory._44_4_ + 1;
    if (1 < (int)memory._44_4_) {
      uVar4 = 0x280;
      if (pNStack_20 != (Node *)0x0) {
        uVar4 = 0x27f;
      }
      prvTidyReport(doc,pNStack_20,node_00,uVar4);
    }
  }
  prvTidyInsertNodeAtEnd(pNStack_20,node_00);
  memset(&pcStack_a0,0,0x30);
  pcStack_a0 = prvTidyParseHead;
  memory_1.identity = (Parser *)pNStack_20;
  memory_1.reentry_state = memory._44_4_;
  memory_1.mode = memory.register_2;
  data.register_1 = memory._44_4_;
  data.mode = memory_1.reentry_mode;
  data._44_4_ = memory_1.register_1;
  data.register_2 = memory.register_2;
  data.original_node = pNStack_20;
  data.identity = prvTidyParseHead;
  data.reentry_node = node_00;
  data._24_8_ = memory_1.reentry_node;
  memory_1.original_node = node_00;
  prvTidypushMemory(doc,data);
  return node_00;
}

Assistant:

Node* TY_(ParseHead)( TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;
    DEBUG_LOG_COUNTERS;

    if ( head == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        head = memory.original_node;
        HasTitle = memory.register_1;
        HasBase = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(head);
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHead);
                memory.original_node = head;
                memory.reentry_node = node;
                memory.register_1 = HasTitle;
                memory.register_2 = HasBase;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}